

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measure.cpp
# Opt level: O0

UBool __thiscall icu_63::Measure::operator==(Measure *this,UObject *other)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  bool local_32;
  bool local_31;
  Measure *m;
  UObject *other_local;
  Measure *this_local;
  
  if (this == (Measure *)other) {
    this_local._7_1_ = true;
  }
  else {
    if (this == (Measure *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                       (type_info *)other->_vptr_UObject[-1]);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      UVar2 = Formattable::operator==(&this->number,(Formattable *)(other + 1));
      local_31 = false;
      if (UVar2 != '\0') {
        local_31 = false;
        if ((this->unit == (MeasureUnit *)0x0) == (other[0xf]._vptr_UObject == (_func_int **)0x0)) {
          local_32 = true;
          if (this->unit != (MeasureUnit *)0x0) {
            iVar3 = (*(this->unit->super_UObject)._vptr_UObject[4])
                              (this->unit,other[0xf]._vptr_UObject);
            local_32 = (char)iVar3 != '\0';
          }
          local_31 = local_32;
        }
      }
      this_local._7_1_ = local_31;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool Measure::operator==(const UObject& other) const {
    if (this == &other) {  // Same object, equal
        return TRUE;
    }
    if (typeid(*this) != typeid(other)) { // Different types, not equal
        return FALSE;
    }
    const Measure &m = static_cast<const Measure&>(other);
    return number == m.number &&
        ((unit == NULL) == (m.unit == NULL)) &&
        (unit == NULL || *unit == *m.unit);
}